

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregate_State_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Aggregate_State_PDU::SetAggregateIDList
          (Aggregate_State_PDU *this,
          vector<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
          *AI)

{
  KUINT16 *pKVar1;
  undefined2 uVar2;
  KUINT16 KVar3;
  
  uVar2 = this->m_ui16NumAggregates;
  pKVar1 = &(this->super_Header).super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + uVar2 * -6;
  std::
  vector<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
  ::operator=(&this->m_vAI,AI);
  KVar3 = (KUINT16)((uint)(*(int *)&(this->m_vAI).
                                    super__Vector_base<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                          *(int *)&(this->m_vAI).
                                   super__Vector_base<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4);
  this->m_ui16NumAggregates = KVar3;
  pKVar1 = &(this->super_Header).super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + KVar3 * 6;
  updatePadding(this);
  return;
}

Assistant:

void Aggregate_State_PDU::SetAggregateIDList( const vector<AggregateIdentifier> & AI )
{
    // Reset the PDU length field
    m_ui16PDULength -= m_ui16NumAggregates * AggregateIdentifier::AGGREGATE_IDENTIFER_SIZE;

    m_vAI = AI;
    m_ui16NumAggregates = m_vAI.size();
    m_ui16PDULength += m_ui16NumAggregates * AggregateIdentifier::AGGREGATE_IDENTIFER_SIZE;
    updatePadding();
}